

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status filemgr_sync(filemgr *file,bool sync_option,err_log_callback *log_callback)

{
  filemgr *file_00;
  byte in_SIL;
  long in_RDI;
  int rv;
  uint64_t exp_filesize;
  fdb_status result;
  char *in_stack_000001e8;
  char *in_stack_000001f0;
  fdb_status in_stack_000001fc;
  err_log_callback *in_stack_00000200;
  filemgr_ops *in_stack_00000208;
  undefined4 in_stack_ffffffffffffffc8;
  memory_order in_stack_ffffffffffffffcc;
  atomic<unsigned_long> *in_stack_ffffffffffffffd0;
  fdb_status local_24;
  fdb_status local_4;
  
  local_24 = FDB_RESULT_SUCCESS;
  file_00 = (filemgr *)atomic_get_uint64_t(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if ((global_config.ncacheblock < 1) ||
     (local_24 = bcache_flush(file_00), local_24 == FDB_RESULT_SUCCESS)) {
    if (((in_SIL & 1) == 0) || ((*(byte *)(in_RDI + 0xc) & 1) == 0)) {
      atomic_init_uint64_t
                ((atomic<unsigned_long> *)file_00,
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_4 = local_24;
    }
    else {
      local_4 = (**(code **)(*(long *)(in_RDI + 0xe8) + 0x38))(*(undefined4 *)(in_RDI + 0x14));
      _log_errno_str(in_stack_00000208,in_stack_00000200,in_stack_000001fc,in_stack_000001f0,
                     in_stack_000001e8);
    }
  }
  else {
    _log_errno_str(in_stack_00000208,in_stack_00000200,in_stack_000001fc,in_stack_000001f0,
                   in_stack_000001e8);
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

fdb_status filemgr_sync(struct filemgr *file, bool sync_option,
                        err_log_callback *log_callback)
{
    fdb_status result = FDB_RESULT_SUCCESS;
    uint64_t exp_filesize = atomic_get_uint64_t(&file->pos);
    if (global_config.ncacheblock > 0) {
        result = bcache_flush(file);
        if (result != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, (fdb_status) result,
                           "FLUSH", file->filename);
            return result;
        }
    }

    if (sync_option && file->fflags & FILEMGR_SYNC) {
        int rv = file->ops->fsync(file->fd);
        _log_errno_str(file->ops, log_callback, (fdb_status)rv, "FSYNC", file->filename);
        return (fdb_status) rv;
    }
    atomic_init_uint64_t(&file->latest_filesize, exp_filesize);

    return result;
}